

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_lifo.h
# Opt level: O0

lf_lifo * lf_lifo_push(lf_lifo *head,void *elem)

{
  void *a;
  lf_lifo *plVar1;
  intptr_t iVar2;
  void *pvVar3;
  void *__e;
  void **__ep;
  void *newhead;
  void *tail;
  void *elem_local;
  lf_lifo *head_local;
  
  plVar1 = lf_lifo(elem);
  if (plVar1 != (lf_lifo *)elem) {
    __assert_fail("lf_lifo(elem) == elem",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/lf_lifo.h"
                  ,0x51,"struct lf_lifo *lf_lifo_push(struct lf_lifo *, void *)");
  }
  do {
    a = head->next;
    plVar1 = lf_lifo(elem);
    plVar1->next = a;
    iVar2 = aba_value(a);
    LOCK();
    pvVar3 = head->next;
    if (a == pvVar3) {
      head->next = (void *)((long)elem + (ulong)((int)iVar2 + 1U & 0xffff));
      pvVar3 = a;
    }
    UNLOCK();
  } while (pvVar3 != a);
  return head;
}

Assistant:

static inline struct lf_lifo *
lf_lifo_push(struct lf_lifo *head, void *elem)
{
	assert(lf_lifo(elem) == elem); /* Aligned address. */
	do {
		void *tail = head->next;
		lf_lifo(elem)->next = tail;
		void *newhead = (char *)elem +
				((aba_value(tail) + 1) & SMALL_LIFO_ALIGNMENT);
		if (pm_atomic_compare_exchange_weak(&head->next, &tail, newhead))
			return head;
	} while (true);
}